

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O3

void __thiscall
FDDSTexture::DecompressDXT3(FDDSTexture *this,FWadLump *lump,bool premultiplied,BYTE *tcbuf)

{
  undefined1 *puVar1;
  byte bVar2;
  ushort uVar3;
  undefined4 uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  byte bVar9;
  long lVar10;
  BYTE BVar11;
  int iVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  PalEntry color [4];
  BYTE palcol [4];
  byte local_68 [6];
  byte local_62;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  ulong local_58;
  void *local_50;
  undefined4 local_48;
  BYTE aBStack_44 [4];
  ulong local_40;
  FWadLump *local_38;
  
  local_40 = (ulong)((uint)(this->super_FTexture).Width * 4 + 0xc & 0xfffffff0);
  local_38 = lump;
  local_50 = operator_new__(local_40);
  if ((this->super_FTexture).Height != 0) {
    local_58 = 0;
    do {
      (*(local_38->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                (local_38,local_50,local_40);
      if ((this->super_FTexture).Width != 0) {
        uVar19 = 0;
        pvVar14 = local_50;
        do {
          local_48 = *(undefined4 *)((long)pvVar14 + 8);
          lVar10 = 1;
          do {
            uVar3 = *(ushort *)(aBStack_44 + lVar10 * 2 + -4);
            bVar2 = (byte)(uVar3 >> 8);
            local_68[lVar10 * 4 + 2] = (bVar2 >> 5) + (bVar2 & 0xf8);
            local_68[lVar10 * 4 + 1] = bVar2 >> 1 & 3 | (byte)(uVar3 >> 3) & 0xfc;
            local_68[lVar10 * 4] = ((byte)(uVar3 >> 2) & 7) + (char)uVar3 * '\b';
            bVar20 = lVar10 != 0;
            lVar10 = lVar10 + -1;
          } while (bVar20);
          local_5e = (char)(((uint)local_62 + (uint)local_68[2] * 2 + 1) / 3);
          local_5f = (char)(((uint)local_68[5] + (uint)local_68[1] * 2 + 1) / 3);
          local_60 = (char)(((uint)local_68[4] + (uint)local_68[0] * 2 + 1) / 3);
          local_5a = (char)(((uint)local_68[2] + (uint)local_62 * 2 + 1) / 3);
          local_5b = (char)(((uint)local_68[1] + (uint)local_68[5] * 2 + 1) / 3);
          local_5c = (char)(((uint)local_68[0] + (uint)local_68[4] * 2 + 1) / 3);
          if (tcbuf == (BYTE *)0x0) {
            lVar10 = 3;
            do {
              aBStack_44[lVar10] =
                   RGB32k.All
                   [(ulong)(local_68[lVar10 * 4] >> 3) +
                    (ulong)(local_68[lVar10 * 4 + 1] & 0xfffffff8) * 4 +
                    (ulong)((local_68[lVar10 * 4 + 2] & 0xf8) << 7)];
              bVar20 = lVar10 != 0;
              lVar10 = lVar10 + -1;
            } while (bVar20);
          }
          uVar15 = local_58 & 0xffffffff;
          uVar16 = 0;
          do {
            if ((ulong)(this->super_FTexture).Height <= (uVar16 | local_58)) break;
            bVar2 = *(byte *)((long)pvVar14 + uVar16 + 0xc);
            uVar3 = *(ushort *)((long)pvVar14 + uVar16 * 2);
            bVar9 = 0;
            iVar12 = 0;
            uVar13 = uVar19;
            do {
              uVar18 = (uint)uVar13;
              uVar17 = (uint)(this->super_FTexture).Width;
              if (uVar17 <= uVar18) break;
              if (tcbuf == (BYTE *)0x0) {
                if ((uVar3 >> (bVar9 & 0x1f) & 8) == 0) {
                  puVar1 = &(this->super_FTexture).field_0x31;
                  *puVar1 = *puVar1 | 8;
                  BVar11 = '\0';
                }
                else {
                  BVar11 = aBStack_44[bVar2 >> ((byte)iVar12 & 0x1f) & 3];
                }
                this->Pixels[uVar13 * (this->super_FTexture).Height + (uVar16 | local_58)] = BVar11;
              }
              else {
                uVar4 = *(undefined4 *)(local_68 + (ulong)(bVar2 >> ((byte)iVar12 & 0x1f) & 3) * 4);
                auVar21 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(
                                                  byte)((uint)uVar4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar4 >> 0x10),uVar4)) >>
                                                  0x20),uVar4) >> 0x18),(char)((uint)uVar4 >> 8)),
                                           (ushort)(byte)uVar4) & 0xffffff00ffffff);
                auVar21 = pshuflw(auVar21,auVar21,0xc6);
                sVar5 = auVar21._0_2_;
                sVar6 = auVar21._2_2_;
                sVar7 = auVar21._4_2_;
                sVar8 = auVar21._6_2_;
                *(uint *)(tcbuf + (int)((uVar17 * (int)uVar15 + uVar18) * 4)) =
                     CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar21[6] - (0xff < sVar8),
                              CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar21[4] - (0xff < sVar7),
                                       CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar21[2] -
                                                (0xff < sVar6),
                                                (0 < sVar5) * (sVar5 < 0x100) * auVar21[0] -
                                                (0xff < sVar5))));
              }
              iVar12 = iVar12 + 2;
              uVar13 = (ulong)(uVar18 + 1);
              bVar9 = bVar9 + 4;
            } while (iVar12 != 8);
            uVar16 = uVar16 + 1;
            uVar15 = (ulong)((int)uVar15 + 1);
          } while (uVar16 != 4);
          pvVar14 = (void *)((long)pvVar14 + 0x10);
          uVar18 = (int)uVar19 + 4;
          uVar19 = (ulong)uVar18;
        } while (uVar18 < (this->super_FTexture).Width);
      }
      local_58 = local_58 + 4;
    } while (local_58 < (this->super_FTexture).Height);
  }
  operator_delete__(local_50);
  return;
}

Assistant:

void FDDSTexture::DecompressDXT3 (FWadLump &lump, bool premultiplied, BYTE *tcbuf)
{
	const long blocklinelen = ((Width + 3) >> 2) << 4;
	BYTE *blockbuff = new BYTE[blocklinelen];
	BYTE *block;
	PalEntry color[4];
	BYTE palcol[4];
	int ox, oy, x, y, i;

	for (oy = 0; oy < Height; oy += 4)
	{
		lump.Read (blockbuff, blocklinelen);
		block = blockbuff;
		for (ox = 0; ox < Width; ox += 4)
		{
			WORD color16[2] = { LittleShort(((WORD *)block)[4]), LittleShort(((WORD *)block)[5]) };

			// Convert color from R5G6B5 to R8G8B8.
			for (i = 1; i >= 0; --i)
			{
				color[i].r = ((color16[i] & 0xF800) >> 8) | (color16[i] >> 13);
				color[i].g = ((color16[i] & 0x07E0) >> 3) | ((color16[i] & 0x0600) >> 9);
				color[i].b = ((color16[i] & 0x001F) << 3) | ((color16[i] & 0x001C) >> 2);
			}
			// Derive the other two colors.
			color[2].r = (color[0].r + color[0].r + color[1].r + 1) / 3;
			color[2].g = (color[0].g + color[0].g + color[1].g + 1) / 3;
			color[2].b = (color[0].b + color[0].b + color[1].b + 1) / 3;

			color[3].r = (color[0].r + color[1].r + color[1].r + 1) / 3;
			color[3].g = (color[0].g + color[1].g + color[1].g + 1) / 3;
			color[3].b = (color[0].b + color[1].b + color[1].b + 1) / 3;

			// Pick colors from the palette for each of the four colors.
			if (!tcbuf) for (i = 3; i >= 0; --i)
			{
				palcol[i] = RGB32k.RGB[color[i].r >> 3][color[i].g >> 3][color[i].b >> 3];
			}
			// Now decode this 4x4 block to the pixel buffer.
			for (y = 0; y < 4; ++y)
			{
				if (oy + y >= Height)
				{
					break;
				}
				BYTE yslice = block[12 + y];
				WORD yalphaslice = LittleShort(((WORD *)block)[y]);
				for (x = 0; x < 4; ++x)
				{
					if (ox + x >= Width)
					{
						break;
					}
					if (!tcbuf)
					{
						Pixels[oy + y + (ox + x) * Height] = ((yalphaslice >> (x*4)) & 15) < 8 ?
							(bMasked = true, 0) : palcol[(yslice >> (x + x)) & 3];
					}
					else
					{
						BYTE * tcp = &tcbuf[(ox + x)*4 + (oy + y) * Width*4];
						int c = (yslice >> (x + x)) & 3;
						tcp[0] = color[c].r;
						tcp[1] = color[c].g;
						tcp[2] = color[c].b;
						tcp[3] = color[c].a;
					}
				}
			}
			block += 16;
		}
	}
	delete[] blockbuff;
}